

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O1

double FindLocalLayerHeight
                 (vector<vector3,_std::allocator<vector3>_> *existing_layer,vector3 *test_vertex,
                 bool is_first_layer)

{
  pointer pvVar1;
  ulong uVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double dVar7;
  double in_XMM4_Qa;
  
  if (CONCAT31(in_register_00000011,is_first_layer) == 0) {
    pvVar1 = (existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
        super__Vector_impl_data._M_finish != pvVar1) {
      lVar4 = 0x10;
      uVar3 = 0;
      dVar6 = 1000.0;
      do {
        uVar2 = *(ulong *)((long)&pvVar1->x + lVar4);
        dVar5 = test_vertex->x - *(double *)((long)pvVar1 + lVar4 + -0x10);
        dVar7 = test_vertex->y - *(double *)((long)pvVar1 + lVar4 + -8);
        dVar5 = dVar5 * dVar5 + dVar7 * dVar7;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        in_XMM4_Qa = (double)(~-(ulong)(dVar5 < dVar6) & (ulong)in_XMM4_Qa |
                             uVar2 & -(ulong)(dVar5 < dVar6));
        if (dVar6 <= dVar5) {
          dVar5 = dVar6;
        }
        uVar3 = uVar3 + 1;
        pvVar1 = (existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = ((long)(existing_layer->super__Vector_base<vector3,_std::allocator<vector3>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                -0x5555555555555555;
        lVar4 = lVar4 + 0x18;
        dVar6 = dVar5;
        in_XMM1_Qa = in_XMM4_Qa;
      } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
    }
    dVar6 = test_vertex->z - in_XMM1_Qa;
  }
  else {
    dVar6 = test_vertex->z;
  }
  return dVar6;
}

Assistant:

double FindLocalLayerHeight(std::vector<vector3> *existing_layer, vector3 &test_vertex, bool is_first_layer)
{
  if (is_first_layer)
  {
    return test_vertex.z;
  }

  vector3 temp_vertex, nearest_vertex;
  double minimun_distance = 1000, temp_distance;
  for (int i = 0; i < existing_layer->size(); i++)
  {
    temp_vertex = (*existing_layer)[i];
    temp_distance = (test_vertex - temp_vertex).XYLength();
    if (temp_distance < minimun_distance)
    {
      minimun_distance = temp_distance;
      nearest_vertex = temp_vertex;
    }
  }

  return test_vertex.z - nearest_vertex.z;
}